

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.h
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::MacOSXContentGeneratorType::~MacOSXContentGeneratorType
          (MacOSXContentGeneratorType *this)

{
  ~MacOSXContentGeneratorType(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

MacOSXContentGeneratorType(cmNinjaTargetGenerator* g,
                               std::string fileConfig)
      : Generator(g)
      , FileConfig(std::move(fileConfig))
    {
    }